

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

void __thiscall
GF2::MP<6UL,_GF2::MOLex<6UL>_>::SymDiffSplice
          (MP<6UL,_GF2::MOLex<6UL>_> *this,MP<6UL,_GF2::MOLex<6UL>_> *polyRight)

{
  iterator __position;
  int __fdout;
  undefined8 unaff_RBX;
  __off64_t *in_R8;
  size_t in_R9;
  _List_node_base *p_Var1;
  uint in_stack_00000008;
  
  if (this == polyRight) {
    std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::clear
              (&this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>);
    return;
  }
  __position._M_node =
       (this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
       super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
  p_Var1 = (polyRight->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>).
           super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while ((__fdout = (int)p_Var1, __position._M_node != (_List_node_base *)this &&
         (p_Var1 != (_List_node_base *)polyRight))) {
    if (*(_List_node_base **)
         &((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)(p_Var1 + 1))->
          super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> <
        __position._M_node[1]._M_next) {
      __position._M_node = (__position._M_node)->_M_next;
    }
    else if (__position._M_node[1]._M_next ==
             *(_List_node_base **)
              &((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)(p_Var1 + 1))->
               super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>) {
      __position = std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::erase
                             (&this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>,
                              __position._M_node);
      p_Var1 = (((list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_> *)&p_Var1->_M_next)->
               super__List_base<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
    }
    else {
      p_Var1 = p_Var1->_M_next;
      std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::splice
                (&this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>,
                 (int)__position._M_node,(__off64_t *)polyRight,__fdout,in_R8,in_R9,(uint)unaff_RBX)
      ;
    }
  }
  if (__position._M_node != (_List_node_base *)this) {
    return;
  }
  std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::splice
            (&this->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>,(int)this,
             (__off64_t *)polyRight,__fdout,(__off64_t *)polyRight,in_R9,in_stack_00000008);
  return;
}

Assistant:

void SymDiffSplice(MP& polyRight)
	{	
		assert(IsConsistent(polyRight));
		// к самому себе?
		if (this == &polyRight)
		{
			SetEmpty();
			return;
		}
		iterator iter = begin(), iterRight = polyRight.begin(), iterNext;
		while (iter != end() && iterRight != polyRight.end())
		{
			int cmp = _order.Compare(*iter, *iterRight);
			if (cmp > 0) ++iter;
			else 
			{
				// *iter < *iterRight?
				if (cmp < 0)
				{
					// запомнить следующий моном polyRight
					++(iterNext = iterRight);
					// перенести *iterRight перед *iter	
					splice(iter, polyRight, iterRight);
					// перейти к следующему моному polyRight
					iterRight = iterNext;
				}
				// *iter == *iterRight?
				else iter = erase(iter), ++iterRight;
			}
		}
		// добавить остаток polyRight
		if (iter == end())
			splice(end(), polyRight, iterRight, polyRight.end());
	}